

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitops.h
# Opt level: O2

uint64_t helper_madd64_q_ssov(CPUTriCoreState *env,uint64_t r1,uint32_t r2,uint32_t r3,uint32_t n)

{
  ulong uVar1;
  uint64_t uVar2;
  uint uVar3;
  ulong uVar4;
  int64_t t1;
  ulong uVar5;
  
  uVar4 = (long)(int)r3 * (long)(int)r2 << ((byte)n & 0x3f);
  uVar1 = uVar4 + r1;
  uVar3 = (uint)(uVar1 * 2 >> 0x20) ^ (uint)(uVar1 >> 0x20);
  env->PSW_USB_AV = uVar3;
  env->PSW_USB_SAV = env->PSW_USB_SAV | uVar3;
  uVar5 = ~(r1 ^ uVar4) & (uVar1 ^ uVar4);
  if (n == 1 && (r3 == 0x80000000 && r2 == 0x80000000)) {
    if (-1 < (long)uVar5) {
      env->PSW_USB_V = 0x80000000;
      env->PSW_USB_SV = 0x80000000;
      return 0x7fffffffffffffff;
    }
  }
  else if ((long)uVar5 < 0) {
    env->PSW_USB_V = 0x80000000;
    env->PSW_USB_SV = 0x80000000;
    uVar2 = 0x8000000000000000;
    if (-1 < (long)uVar4) {
      uVar2 = 0x7fffffffffffffff;
    }
    return uVar2;
  }
  env->PSW_USB_V = 0;
  return uVar1;
}

Assistant:

static inline int64_t sextract64(uint64_t value, int start, int length)
{
    assert(start >= 0 && length > 0 && length <= 64 - start);
    /* Note that this implementation relies on right shift of signed
     * integers being an arithmetic shift.
     */
    return ((int64_t)(value << (64 - length - start))) >> (64 - length);
}